

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNStm * __thiscall CTcParser::parse_if(CTcParser *this,int *err)

{
  tc_toktyp_t tVar1;
  CTPNStmBase *this_00;
  int *in_RSI;
  CTcTokenizer *in_RDI;
  int in_stack_00000014;
  CTPNStmSwitch *in_stack_00000018;
  long linenum;
  CTcTokFileDesc *file;
  CTPNStm *else_stm;
  CTPNStm *then_stm;
  CTPNStm *if_stm;
  CTcPrsNode *cond_expr;
  undefined8 in_stack_ffffffffffffff98;
  int errnum;
  CTcTokenizer *in_stack_ffffffffffffffa8;
  CTPNStmIf *in_stack_ffffffffffffffb0;
  long local_48;
  CTcTokFileDesc *local_40;
  CTPNStm *local_38;
  CTPNStm *local_30;
  CTPNStmBase *local_28;
  CTcPrsNode *local_20;
  int *local_18;
  CTPNStmBase *local_8;
  
  errnum = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_18 = in_RSI;
  CTcTokenizer::get_last_pos(G_tok,&local_40,&local_48);
  tVar1 = CTcTokenizer::next(in_stack_ffffffffffffffa8);
  if (tVar1 == TOKT_LPAR) {
    CTcTokenizer::next(in_stack_ffffffffffffffa8);
  }
  else {
    CTcTokenizer::log_error_curtok(in_RDI,errnum);
  }
  local_20 = parse_cond_expr((CTcParser *)in_RDI);
  if (local_20 == (CTcPrsNode *)0x0) {
    *local_18 = 1;
    local_8 = (CTPNStmBase *)0x0;
  }
  else {
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x267d69);
    if (tVar1 == TOKT_RPAR) {
      CTcTokenizer::next(in_stack_ffffffffffffffa8);
    }
    else {
      CTcTokenizer::log_error_curtok(in_RDI,errnum);
    }
    local_30 = parse_stm((CTcParser *)file,(int *)linenum,in_stack_00000018,in_stack_00000014);
    if (*local_18 == 0) {
      tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x267dd4);
      if (tVar1 == TOKT_ELSE) {
        CTcTokenizer::next(in_stack_ffffffffffffffa8);
        local_38 = parse_stm((CTcParser *)file,(int *)linenum,in_stack_00000018,in_stack_00000014);
        if (*local_18 != 0) {
          return (CTPNStm *)0x0;
        }
      }
      else {
        local_38 = (CTPNStm *)0x0;
      }
      this_00 = (CTPNStmBase *)CTcPrsAllocObj::operator_new(0x267e2c);
      CTPNStmIf::CTPNStmIf
                (in_stack_ffffffffffffffb0,(CTcPrsNode *)in_stack_ffffffffffffffa8,(CTPNStm *)in_RDI
                 ,(CTPNStm *)this_00);
      local_28 = this_00;
      CTPNStmBase::set_source_pos(this_00,local_40,local_48);
      local_8 = local_28;
    }
    else {
      local_8 = (CTPNStmBase *)0x0;
    }
  }
  return (CTPNStm *)local_8;
}

Assistant:

CTPNStm *CTcParser::parse_if(int *err)
{
    CTcPrsNode *cond_expr;
    CTPNStm *if_stm;
    CTPNStm *then_stm;
    CTPNStm *else_stm;
    CTcTokFileDesc *file;
    long linenum;
    
    /* save the starting line information for later */
    G_tok->get_last_pos(&file, &linenum);

    /* skip the 'if' keyword, and require the open paren */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip the left paren */
        G_tok->next();
    }
    else
    {
        /* 
         *   log an error, but proceed on the assumption that they simply
         *   left out the paren 
         */
        G_tok->log_error_curtok(TCERR_REQ_LPAR_IF);
    }

    /* parse the expression */
    cond_expr = parse_cond_expr();

    /* if that failed, return failure */
    if (cond_expr == 0)
    {
        *err = TRUE;
        return 0;
    }

    /* require the close paren */
    if (G_tok->cur() == TOKT_RPAR)
    {
        /* skip it */
        G_tok->next();
    }
    else
    {
        /* 
         *   log an error, then proceed assuming that the paren was merely
         *   omitted 
         */
        G_tok->log_error_curtok(TCERR_REQ_RPAR_IF);
    }

    /* parse the true-part statement */
    then_stm = parse_stm(err, 0, FALSE);

    /* if an error occurred, return failure */
    if (*err)
        return 0;

    /* check for 'else' */
    if (G_tok->cur() == TOKT_ELSE)
    {
        /* skip the 'else' keyword */
        G_tok->next();

        /* parse the false-part statement */
        else_stm = parse_stm(err, 0, FALSE);

        /* if an error occurred, return failure */
        if (*err)
            return 0;
    }
    else
    {
        /* there's no 'else' part */
        else_stm = 0;
    }

    /* create and return the 'if' statement node */
    if_stm = new CTPNStmIf(cond_expr, then_stm, else_stm);

    /* set the original statement position in the node */
    if_stm->set_source_pos(file, linenum);

    /* return the 'if' statement node */
    return if_stm;
}